

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void ravi_create_slice(lua_State *L,int idx,uint start,uint len)

{
  code cVar1;
  ushort uVar2;
  int iVar3;
  StkId pTVar4;
  int *piVar5;
  bool bVar6;
  TValue *parent;
  RaviArray *pRVar7;
  byte bVar8;
  char *pcVar9;
  
  iVar3 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar3 + 1;
  if (iVar3 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x37c,"void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
  }
  parent = index2addr(L,idx);
  uVar2 = parent->tt_;
  if ((uVar2 & 0xf) == 5) {
    if (uVar2 == 0x8005) {
      pcVar9 = "cannot create a slice of a table, integer[] or number[] expected";
    }
    else {
      if ((uVar2 != 0x8015) && (uVar2 != 0x8025)) {
        pcVar9 = 
        "(((((parent))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((parent))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
        ;
LAB_00112722:
        __assert_fail(pcVar9,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x386,"void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)")
        ;
      }
      cVar1 = (parent->value_).f[8];
      if ((cVar1 != (code)0x15) && (cVar1 != (code)0x25)) {
        pcVar9 = 
        "((((parent)->value_).gc)->tt == ((5) | ((1) << 4)) || (((parent)->value_).gc)->tt == ((5) | ((2) << 4)))"
        ;
        goto LAB_00112722;
      }
      pcVar9 = "cannot create a slice of given bounds";
      if ((start < len + start && start != 0) &&
         (len + start <= *(uint *)((parent->value_).f + 0xc))) {
        pRVar7 = raviH_new_slice(L,parent,start,len);
        bVar8 = pRVar7->tt & 0xe;
        if (parent->tt_ == 0x8025) {
          if (9 < bVar8) {
            pcVar9 = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_00112769:
            __assert_fail(pcVar9,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x38e,
                          "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
          }
          pTVar4 = L->top;
          (pTVar4->value_).gc = (GCObject *)pRVar7;
          pTVar4->tt_ = 0x8025;
          if ((pRVar7->tt != '%') ||
             ((L != (lua_State *)0x0 && ((pRVar7->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            pcVar9 = "0";
            goto LAB_00112769;
          }
        }
        else {
          if (9 < bVar8) {
            pcVar9 = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_00112788:
            __assert_fail(pcVar9,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x391,
                          "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
          }
          pTVar4 = L->top;
          (pTVar4->value_).gc = (GCObject *)pRVar7;
          pTVar4->tt_ = 0x8015;
          if ((pRVar7->tt != '\x15') ||
             ((L != (lua_State *)0x0 && ((pRVar7->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            pcVar9 = "0";
            goto LAB_00112788;
          }
        }
        pTVar4 = L->top;
        L->top = pTVar4 + 1;
        if (L->ci->top < pTVar4 + 1) {
          __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x393,
                        "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
        }
        bVar6 = true;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        pcVar9 = (char *)0x0;
        goto LAB_0011263d;
      }
    }
  }
  else {
    pcVar9 = "integer[] or number[] expected";
  }
  bVar6 = false;
LAB_0011263d:
  if (!bVar6) {
    luaG_runerror(L,pcVar9);
  }
  piVar5 = *(int **)&L[-1].hookmask;
  *piVar5 = *piVar5 + -1;
  if (*piVar5 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x399,"void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
}

Assistant:

LUA_API void ravi_create_slice(lua_State *L, int idx, unsigned int start,
                               unsigned int len) {
  TValue *parent;
  RaviArray *slice;
  const char *errmsg = NULL;
  lua_lock(L);
  parent = index2addr(L, idx);
  if (!ttistable(parent)) {
    errmsg = "integer[] or number[] expected";
    goto done;
  }
  if (ttisLtable(parent)) {
    errmsg = "cannot create a slice of a table, integer[] or number[] expected";
    goto done;
  }
  RaviArray *orig = arrvalue(parent);
  unsigned int slice_len = start + len;
  if (start < 1 || slice_len <= start || slice_len > orig->len) {
    errmsg = "cannot create a slice of given bounds";
    goto done;
  }
  slice = raviH_new_slice(L, parent, start, len);
  if (ttisfarray(parent)) {
    setfarrayvalue(L, L->top, slice);
  }
  else {
    setiarrayvalue(L, L->top, slice);
  }
  api_incr_top(L);
  luaC_checkGC(L);
done:
  if (errmsg)
    luaG_runerror(L, errmsg);
  else
    lua_unlock(L);
}